

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageTemplate.cpp
# Opt level: O0

void __thiscall
ki::protocol::dml::MessageTemplate::set_access_level(MessageTemplate *this,uint8_t access_level)

{
  Record *this_00;
  Field<unsigned_char> *this_01;
  allocator local_39;
  string local_38 [39];
  uint8_t local_11;
  MessageTemplate *pMStack_10;
  uint8_t access_level_local;
  MessageTemplate *this_local;
  
  this_00 = this->m_record;
  local_11 = access_level;
  pMStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"_MsgAccessLvl",&local_39);
  this_01 = ki::dml::Record::add_field<unsigned_char>(this_00,(string *)local_38,true);
  ki::dml::Field<unsigned_char>::set_value(this_01,local_11);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

void MessageTemplate::set_access_level(uint8_t access_level)
	{
		m_record->add_field<ki::dml::UBYT>("_MsgAccessLvl")->set_value(access_level);
	}